

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_requirements(App *this)

{
  bool bVar1;
  size_t sVar2;
  undefined8 uVar3;
  iterator min_option;
  RequiresError *this_00;
  pointer pOVar4;
  reference ppOVar5;
  string *subname;
  size_type sVar6;
  element_type *peVar7;
  allocator<char> *__a;
  long in_RDI;
  App_p *sub_1;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1_6;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> subc_list;
  string option_list;
  App_p *sub;
  iterator __end1_5;
  iterator __begin1_5;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1_5;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  Option *opt_ex;
  iterator __end2_1;
  iterator __begin2_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2_1;
  Option *opt_req;
  iterator __end2;
  iterator __begin2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range2;
  Option_p *opt_2;
  iterator __end1_4;
  iterator __begin1_4;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range1_4;
  size_t used_options;
  App **subc_1;
  iterator __end1_3;
  iterator __begin1_3;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *__range1_3;
  Option **opt_1;
  iterator __end1_2;
  iterator __begin1_2;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range1_2;
  string missing_need;
  bool missing_needed;
  App **subc;
  iterator __end1_1;
  iterator __begin1_1;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *__range1_1;
  Option **opt;
  iterator __end1;
  iterator __begin1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range1;
  string excluder;
  bool excluded;
  App *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  allocator<char> *__s;
  App *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  ulong uVar8;
  string *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb28;
  ExcludesError *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb50;
  undefined1 uVar9;
  App *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  in_stack_fffffffffffffba0;
  App *in_stack_fffffffffffffba8;
  allocator<char> local_449;
  undefined1 local_448 [40];
  undefined1 local_420 [104];
  undefined1 local_3b8 [31];
  allocator<char> local_399 [73];
  reference local_350;
  shared_ptr<CLI::App> *local_348;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_340;
  long local_338;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_330;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *in_stack_fffffffffffffcf0;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffcf8;
  _Self local_2c8;
  _Self local_2c0;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *local_2b8;
  undefined1 local_2a9;
  Option *local_268;
  _Self local_260;
  _Self local_258;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *local_250;
  undefined1 local_241;
  reference local_220;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_218;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_210;
  long local_208;
  undefined8 in_stack_fffffffffffffe00;
  ulong uVar10;
  undefined2 uVar11;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  string *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  reference in_stack_fffffffffffffe70;
  _Self local_180;
  long local_178;
  reference local_150;
  _Self local_148;
  _Self local_140;
  long local_138;
  byte local_109;
  undefined4 local_108;
  undefined1 local_101;
  reference local_a0;
  _Self local_98;
  _Self local_90;
  long local_88;
  reference local_50;
  _Self local_48;
  _Self local_40;
  long local_38;
  undefined7 in_stack_fffffffffffffff0;
  byte bVar12;
  
  bVar12 = 0;
  ::std::__cxx11::string::string(in_stack_fffffffffffffad0);
  local_38 = in_RDI + 0x230;
  local_40._M_node =
       (_Base_ptr)
       std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                 ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                  in_stack_fffffffffffffab8);
  local_48._M_node =
       (_Base_ptr)
       std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                 ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                  in_stack_fffffffffffffab8);
  while (bVar1 = std::operator==(&local_40,&local_48), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                         ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
    sVar2 = Option::count((Option *)0x1b8a49);
    if (sVar2 != 0) {
      bVar12 = 1;
      Option::get_name_abi_cxx11_
                ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                 SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffffe00 >> 0x30,0));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
    }
    std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
              ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
  }
  local_88 = in_RDI + 0x200;
  local_90._M_node =
       (_Base_ptr)
       std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::begin
                 ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)
                  in_stack_fffffffffffffab8);
  local_98._M_node =
       (_Base_ptr)
       std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::end
                 ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)
                  in_stack_fffffffffffffab8);
  while (bVar1 = std::operator==(&local_90,&local_98), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_a0 = std::_Rb_tree_const_iterator<CLI::App_*>::operator*
                         ((_Rb_tree_const_iterator<CLI::App_*> *)in_stack_fffffffffffffac0);
    in_stack_fffffffffffffb58 = (App *)count_all(in_stack_fffffffffffffb00);
    if (in_stack_fffffffffffffb58 != (App *)0x0) {
      bVar12 = 1;
      get_display_name_abi_cxx11_
                (in_stack_fffffffffffffb58,SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
    }
    std::_Rb_tree_const_iterator<CLI::App_*>::operator++
              ((_Rb_tree_const_iterator<CLI::App_*> *)in_stack_fffffffffffffac0);
  }
  if ((bVar12 & 1) == 0) {
    local_109 = 0;
    ::std::__cxx11::string::string(in_stack_fffffffffffffad0);
    local_138 = in_RDI + 0x290;
    local_140._M_node =
         (_Base_ptr)
         std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                   ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                    in_stack_fffffffffffffab8);
    local_148._M_node =
         (_Base_ptr)
         std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                   ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                    in_stack_fffffffffffffab8);
    while (bVar1 = std::operator==(&local_140,&local_148), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_150 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                            ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
      sVar2 = Option::count((Option *)0x1b8da7);
      if (sVar2 == 0) {
        local_109 = 1;
        Option::get_name_abi_cxx11_
                  ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                   SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffffe00 >> 0x30,0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
      }
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
    }
    local_178 = in_RDI + 0x260;
    local_180._M_node =
         (_Base_ptr)
         std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::begin
                   ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)
                    in_stack_fffffffffffffab8);
    min_option = std::set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>::end
                           ((set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *)
                            in_stack_fffffffffffffab8);
    while( true ) {
      bVar1 = std::operator==(&local_180,(_Self *)&stack0xfffffffffffffe78);
      uVar9 = (undefined1)((ulong)in_stack_fffffffffffffb50 >> 0x38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffe70 =
           std::_Rb_tree_const_iterator<CLI::App_*>::operator*
                     ((_Rb_tree_const_iterator<CLI::App_*> *)in_stack_fffffffffffffac0);
      sVar2 = count_all(in_stack_fffffffffffffb00);
      if (sVar2 == 0) {
        local_109 = 1;
        get_display_name_abi_cxx11_
                  (in_stack_fffffffffffffb58,SUB81((ulong)in_stack_fffffffffffffb50 >> 0x38,0));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
      }
      std::_Rb_tree_const_iterator<CLI::App_*>::operator++
                ((_Rb_tree_const_iterator<CLI::App_*> *)in_stack_fffffffffffffac0);
    }
    if ((local_109 & 1) == 0) {
      uVar10 = 0;
      local_208 = in_RDI + 0xd8;
      local_210._M_current =
           (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
           std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)in_stack_fffffffffffffab8);
      local_218 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  std::
                  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffffab8);
      while (bVar1 = __gnu_cxx::
                     operator==<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                 *)in_stack_fffffffffffffab8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_220 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    ::operator*(&local_210);
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b90ed);
        sVar2 = Option::count((Option *)0x1b90f5);
        if (sVar2 != 0) {
          uVar10 = uVar10 + 1;
        }
        pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b911c);
        bVar1 = OptionBase<CLI::Option>::get_required(&pOVar4->super_OptionBase<CLI::Option>);
        if (bVar1) {
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b913a);
          sVar2 = Option::count((Option *)0x1b9142);
          if (sVar2 == 0) {
            local_241 = 1;
            uVar3 = __cxa_allocate_exception(0x38);
            uVar11 = (undefined2)(uVar10 >> 0x30);
            std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b9170);
            Option::get_name_abi_cxx11_
                      ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                       SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
            RequiredError::RequiredError
                      ((RequiredError *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
            local_241 = 0;
            __cxa_throw(uVar3,&RequiredError::typeinfo,RequiredError::~RequiredError);
          }
        }
        pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b921e);
        local_250 = &pOVar4->needs_;
        local_258._M_node =
             (_Base_ptr)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                   in_stack_fffffffffffffab8);
        local_260._M_node =
             (_Base_ptr)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                       ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                         *)in_stack_fffffffffffffab8);
        while (bVar1 = std::operator==(&local_258,&local_260), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                              ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
          local_268 = *ppOVar5;
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b929b);
          sVar2 = Option::count((Option *)0x1b92a3);
          if ((sVar2 != 0) && (sVar2 = Option::count((Option *)0x1b92ba), sVar2 == 0)) {
            local_2a9 = 1;
            subname = (string *)__cxa_allocate_exception(0x38);
            uVar11 = (undefined2)(uVar10 >> 0x30);
            std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b92e8);
            Option::get_name_abi_cxx11_
                      ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                       SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
            Option::get_name_abi_cxx11_
                      ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                       SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
            RequiresError::RequiresError
                      ((RequiresError *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,subname)
            ;
            local_2a9 = 0;
            __cxa_throw(subname,&RequiresError::typeinfo,RequiresError::~RequiresError);
          }
          std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                    ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
        }
        pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b93f0);
        local_2b8 = &pOVar4->excludes_;
        local_2c0._M_node =
             (_Base_ptr)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                   in_stack_fffffffffffffab8);
        local_2c8._M_node =
             (_Base_ptr)
             std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                       ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                         *)in_stack_fffffffffffffab8);
        while (bVar1 = std::operator==(&local_2c0,&local_2c8), ((bVar1 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                    ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
          std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                    ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b946d);
          sVar2 = Option::count((Option *)0x1b9475);
          if ((sVar2 != 0) && (sVar2 = Option::count((Option *)0x1b948c), sVar2 != 0)) {
            uVar3 = __cxa_allocate_exception(0x38);
            uVar11 = (undefined2)(uVar10 >> 0x30);
            std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                      ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x1b94ba);
            Option::get_name_abi_cxx11_
                      ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                       SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
            Option::get_name_abi_cxx11_
                      ((Option *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                       SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0));
            ExcludesError::ExcludesError
                      (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20
                      );
            __cxa_throw(uVar3,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
          }
          std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                    ((_Rb_tree_const_iterator<CLI::Option_*> *)in_stack_fffffffffffffac0);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&local_210);
      }
      if (*(long *)(in_RDI + 0x2e8) != 0) {
        get_subcommands(in_stack_fffffffffffffab8);
        uVar8 = *(ulong *)(in_RDI + 0x2e8);
        sVar6 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::size(&local_330);
        if (sVar6 < uVar8) {
          uVar3 = __cxa_allocate_exception(0x38);
          RequiredError::Subcommand(CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          __cxa_throw(uVar3,&RequiredError::typeinfo,RequiredError::~RequiredError);
        }
        std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
                  ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)in_stack_fffffffffffffad0);
      }
      local_338 = in_RDI + 0x2c0;
      local_340._M_current =
           (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 in_stack_fffffffffffffab8);
      local_348 = (shared_ptr<CLI::App> *)
                  std::
                  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
                  end((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       *)in_stack_fffffffffffffab8);
      while (bVar1 = __gnu_cxx::
                     operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)in_stack_fffffffffffffab8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_350 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                    ::operator*(&local_340);
        peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b9745);
        if ((peVar7->disabled_ & 1U) == 0) {
          std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1b975a);
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b9766);
          if (bVar1) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b9779);
            in_stack_fffffffffffffb00 = (App *)count_all(in_stack_fffffffffffffb00);
            if (in_stack_fffffffffffffb00 != (App *)0x0) {
              uVar10 = uVar10 + 1;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator++(&local_340);
      }
      if ((uVar10 < *(ulong *)(in_RDI + 0x2f8)) ||
         ((*(long *)(in_RDI + 0x300) != 0 && (*(ulong *)(in_RDI + 0x300) < uVar10)))) {
        __a = (allocator<char> *)(in_RDI + 0xd8);
        __s = local_399;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb00,(char *)__s,__a);
        CLI::detail::
        join<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>,CLI::App::_process_requirements()::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_,void>
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,
                   (string *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
        ::std::allocator<char>::~allocator(local_399);
        ::std::function<bool(CLI::App*)>::
        function<CLI::App::_process_requirements()::_lambda(CLI::App*)_1_,void>
                  ((function<bool_(CLI::App_*)> *)in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8);
        get_subcommands(in_stack_fffffffffffffba8,
                        (function<bool_(CLI::App_*)> *)in_stack_fffffffffffffba0._M_current);
        std::function<bool_(CLI::App_*)>::~function((function<bool_(CLI::App_*)> *)0x1b98d4);
        bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                          ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)
                           in_stack_fffffffffffffad0);
        if (!bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb00,(char *)__s,__a);
          CLI::detail::
          join<std::vector<CLI::App*,std::allocator<CLI::App*>>,CLI::App::_process_requirements()::_lambda(CLI::App_const*)_1_,void>
                    (local_420,local_3b8,local_448);
          ::std::operator+((char *)in_stack_fffffffffffffac8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffac0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffac0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffab8);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
          ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
          ::std::allocator<char>::~allocator(&local_449);
        }
        uVar3 = __cxa_allocate_exception(0x38);
        RequiredError::Option
                  ((size_t)min_option._M_node,(size_t)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        __cxa_throw(uVar3,&RequiredError::typeinfo,RequiredError::~RequiredError);
      }
      std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 in_stack_fffffffffffffab8);
      std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 in_stack_fffffffffffffab8);
      while (bVar1 = __gnu_cxx::
                     operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                               ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)in_stack_fffffffffffffac0,
                                (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                 *)in_stack_fffffffffffffab8), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator*((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                     *)&stack0xfffffffffffffba0);
        peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1b9bd5);
        if ((peVar7->disabled_ & 1U) == 0) {
          std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1b9bed);
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1b9bf9);
          if ((bVar1) &&
             (peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b9c0f), (peVar7->required_ & 1U) == 0)) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b9c2d);
            sVar2 = count_all(in_stack_fffffffffffffb00);
            if ((sVar2 == 0) &&
               (((*(long *)(in_RDI + 0x2f8) != 0 && (*(ulong *)(in_RDI + 0x2f8) <= uVar10)) ||
                ((*(long *)(in_RDI + 0x300) != 0 && (*(ulong *)(in_RDI + 0x2f8) <= uVar10))))))
            goto LAB_001b9e0a;
          }
          peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b9cb8);
          sVar2 = count(peVar7);
          if (sVar2 == 0) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b9cdf);
            bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            0x1b9ceb);
            if (bVar1) goto LAB_001b9cf1;
          }
          else {
LAB_001b9cf1:
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b9cfe);
            _process_requirements((App *)CONCAT17(bVar12,in_stack_fffffffffffffff0));
          }
          peVar7 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b9d17);
          if ((peVar7->required_ & 1U) != 0) {
            std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1b9d2e);
            in_stack_fffffffffffffac0 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 count_all(in_stack_fffffffffffffb00);
            uVar9 = (undefined1)((ulong)in_stack_fffffffffffffb50 >> 0x38);
            if (in_stack_fffffffffffffac0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              uVar3 = __cxa_allocate_exception(0x38);
              std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1b9d6f);
              get_display_name_abi_cxx11_(in_stack_fffffffffffffb58,(bool)uVar9);
              RequiredError::RequiredError
                        ((RequiredError *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
              __cxa_throw(uVar3,&RequiredError::typeinfo,RequiredError::~RequiredError);
            }
          }
        }
LAB_001b9e0a:
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
        ::operator++((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                      *)&stack0xfffffffffffffba0);
      }
      local_108 = 0;
    }
    else {
      sVar2 = count_all(in_stack_fffffffffffffb00);
      if (sVar2 != 0) {
        this_00 = (RequiresError *)__cxa_allocate_exception(0x38);
        get_display_name_abi_cxx11_(in_stack_fffffffffffffb58,(bool)uVar9);
        ::std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        RequiresError::RequiresError(this_00,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
        __cxa_throw(this_00,&RequiresError::typeinfo,RequiresError::~RequiresError);
      }
      local_108 = 1;
    }
    ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
  }
  else {
    sVar2 = count_all(in_stack_fffffffffffffb00);
    if (sVar2 != 0) {
      local_101 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      get_display_name_abi_cxx11_(in_stack_fffffffffffffb58,SUB81(sVar2 >> 0x38,0));
      ::std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      ExcludesError::ExcludesError
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
      local_101 = 0;
      __cxa_throw(uVar3,&ExcludesError::typeinfo,ExcludesError::~ExcludesError);
    }
    local_108 = 1;
  }
  ::std::__cxx11::string::~string(in_stack_fffffffffffffac0);
  return;
}

Assistant:

CLI11_INLINE void App::_process_requirements() {
    // check excludes
    bool excluded{false};
    std::string excluder;
    for(const auto &opt : exclude_options_) {
        if(opt->count() > 0) {
            excluded = true;
            excluder = opt->get_name();
        }
    }
    for(const auto &subc : exclude_subcommands_) {
        if(subc->count_all() > 0) {
            excluded = true;
            excluder = subc->get_display_name();
        }
    }
    if(excluded) {
        if(count_all() > 0) {
            throw ExcludesError(get_display_name(), excluder);
        }
        // if we are excluded but didn't receive anything, just return
        return;
    }

    // check excludes
    bool missing_needed{false};
    std::string missing_need;
    for(const auto &opt : need_options_) {
        if(opt->count() == 0) {
            missing_needed = true;
            missing_need = opt->get_name();
        }
    }
    for(const auto &subc : need_subcommands_) {
        if(subc->count_all() == 0) {
            missing_needed = true;
            missing_need = subc->get_display_name();
        }
    }
    if(missing_needed) {
        if(count_all() > 0) {
            throw RequiresError(get_display_name(), missing_need);
        }
        // if we missing something but didn't have any options, just return
        return;
    }

    std::size_t used_options = 0;
    for(const Option_p &opt : options_) {

        if(opt->count() != 0) {
            ++used_options;
        }
        // Required but empty
        if(opt->get_required() && opt->count() == 0) {
            throw RequiredError(opt->get_name());
        }
        // Requires
        for(const Option *opt_req : opt->needs_)
            if(opt->count() > 0 && opt_req->count() == 0)
                throw RequiresError(opt->get_name(), opt_req->get_name());
        // Excludes
        for(const Option *opt_ex : opt->excludes_)
            if(opt->count() > 0 && opt_ex->count() != 0)
                throw ExcludesError(opt->get_name(), opt_ex->get_name());
    }
    // check for the required number of subcommands
    if(require_subcommand_min_ > 0) {
        auto selected_subcommands = get_subcommands();
        if(require_subcommand_min_ > selected_subcommands.size())
            throw RequiredError::Subcommand(require_subcommand_min_);
    }

    // Max error cannot occur, the extra subcommand will parse as an ExtrasError or a remaining item.

    // run this loop to check how many unnamed subcommands were actually used since they are considered options
    // from the perspective of an App
    for(App_p &sub : subcommands_) {
        if(sub->disabled_)
            continue;
        if(sub->name_.empty() && sub->count_all() > 0) {
            ++used_options;
        }
    }

    if(require_option_min_ > used_options || (require_option_max_ > 0 && require_option_max_ < used_options)) {
        auto option_list = detail::join(options_, [this](const Option_p &ptr) {
            if(ptr.get() == help_ptr_ || ptr.get() == help_all_ptr_) {
                return std::string{};
            }
            return ptr->get_name(false, true);
        });

        auto subc_list = get_subcommands([](App *app) { return ((app->get_name().empty()) && (!app->disabled_)); });
        if(!subc_list.empty()) {
            option_list += "," + detail::join(subc_list, [](const App *app) { return app->get_display_name(); });
        }
        throw RequiredError::Option(require_option_min_, require_option_max_, used_options, option_list);
    }

    // now process the requirements for subcommands if needed
    for(App_p &sub : subcommands_) {
        if(sub->disabled_)
            continue;
        if(sub->name_.empty() && sub->required_ == false) {
            if(sub->count_all() == 0) {
                if(require_option_min_ > 0 && require_option_min_ <= used_options) {
                    continue;
                    // if we have met the requirement and there is nothing in this option group skip checking
                    // requirements
                }
                if(require_option_max_ > 0 && used_options >= require_option_min_) {
                    continue;
                    // if we have met the requirement and there is nothing in this option group skip checking
                    // requirements
                }
            }
        }
        if(sub->count() > 0 || sub->name_.empty()) {
            sub->_process_requirements();
        }

        if(sub->required_ && sub->count_all() == 0) {
            throw(CLI::RequiredError(sub->get_display_name()));
        }
    }
}